

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_OpdatasetGetActive_Test::~InterpreterTestSuite_PC_OpdatasetGetActive_Test
          (InterpreterTestSuite_PC_OpdatasetGetActive_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_OpdatasetGetActive)
{
    TestContext ctx;
    InitContext(ctx);

    NetworkId nwk_id;
    EXPECT_EQ(ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, "", 1, 0, 0, "", 0}, nwk_id),
              PersistentStorage::Status::kSuccess);
    Network nwk;
    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(utils::Hex(nwk.mPan), "0x0000");

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetActiveDataset(_, _))
        .Times(2)
        .WillRepeatedly(DoAll(WithArg<0>([](ActiveOperationalDataset &a) {
                                  a.mExtendedPanId = ByteArray{0, 0, 0, 0, 0, 0, 0, 1};
                                  a.mPanId         = 1;
                                  a.mPresentFlags =
                                      ActiveOperationalDataset::kPanIdBit | ActiveOperationalDataset::kExtendedPanIdBit;
                              }),
                              Return(Error{})));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nwk.mPan, 0x0001);

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active --export ./tmp/aods.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.PrintOrExport(value);
    EXPECT_EQ(PathExists("./tmp/aods.json").GetCode(), ErrorCode::kNone);

    std::string jsonStr;
    EXPECT_EQ(ReadFile(jsonStr, "./tmp/aods.json").GetCode(), ErrorCode::kNone);
    nlohmann::json json = nlohmann::json::parse(jsonStr);
    EXPECT_TRUE(json.contains("PanId"));
    EXPECT_STREQ("0x0001", json.at("PanId").get<std::string>().c_str());
}